

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateArraySetup(ExpressionEvalContext *ctx,ExprArraySetup *expression)

{
  uchar *puVar1;
  long lVar2;
  SynBase *source;
  bool bVar3;
  TypeRef *pTVar4;
  TypeArray *pTVar5;
  ExprBase *pEVar6;
  ExprBase *node;
  ExprPointerLiteral *pEVar7;
  ExprPointerLiteral *this;
  ExprPointerLiteral *shifted;
  uchar *targetPtr;
  uint i;
  ExprPointerLiteral *ptr;
  ExprBase *initializer;
  TypeArray *arrayType;
  TypeRef *refType;
  ExprArraySetup *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar3 = AddInstruction(ctx);
  if (bVar3) {
    pTVar4 = getType<TypeRef>(expression->lhs->type);
    if (pTVar4 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x70f,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pTVar5 = getType<TypeArray>(pTVar4->subType);
    if (pTVar5 == (TypeArray *)0x0) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x713,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pEVar6 = Evaluate(ctx,expression->initializer);
    if (pEVar6 == (ExprBase *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      node = Evaluate(ctx,expression->lhs);
      pEVar7 = getType<ExprPointerLiteral>(node);
      if (pEVar7 == (ExprPointerLiteral *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        for (targetPtr._4_4_ = 0; targetPtr._4_4_ < (uint)pTVar5->length;
            targetPtr._4_4_ = targetPtr._4_4_ + 1) {
          bVar3 = AddInstruction(ctx);
          if (!bVar3) {
            return (ExprBase *)0x0;
          }
          if (pEVar7 == (ExprPointerLiteral *)0x0) {
            __assert_fail("ptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x724,
                          "ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)")
            ;
          }
          if (pEVar7->end <
              pEVar7->ptr + pTVar5->subType->size + (ulong)targetPtr._4_4_ * pTVar5->subType->size)
          {
            __assert_fail("ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x725,
                          "ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)")
            ;
          }
          puVar1 = pEVar7->ptr;
          lVar2 = pTVar5->subType->size;
          this = ExpressionContext::get<ExprPointerLiteral>(ctx->ctx);
          source = (expression->super_ExprBase).source;
          pTVar4 = ExpressionContext::GetReferenceType(ctx->ctx,pTVar5->subType);
          ExprPointerLiteral::ExprPointerLiteral
                    (this,source,&pTVar4->super_TypeBase,puVar1 + (ulong)targetPtr._4_4_ * lVar2,
                     puVar1 + (ulong)targetPtr._4_4_ * lVar2 + pTVar5->subType->size);
          bVar3 = CreateStore(ctx,&this->super_ExprBase,pEVar6);
          if (!bVar3) {
            return (ExprBase *)0x0;
          }
        }
        pEVar6 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
        ExprVoid::ExprVoid((ExprVoid *)pEVar6,(expression->super_ExprBase).source,ctx->ctx->typeVoid
                          );
        ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar6);
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateArraySetup(ExpressionEvalContext &ctx, ExprArraySetup *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	ExprBase *initializer = Evaluate(ctx, expression->initializer);

	if(!initializer)
		return NULL;

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->lhs));

	if(!ptr)
		return NULL;

	for(unsigned i = 0; i < unsigned(arrayType->length); i++)
	{
		if(!AddInstruction(ctx))
			return NULL;

		assert(ptr);
		assert(ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end);

		unsigned char *targetPtr = ptr->ptr + i * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, shifted, initializer))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}